

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentTest::SubTestAttachmentError
          (TextureAttachmentTest *this,GLenum attachment,GLenum texture_target,GLuint level,
          GLuint levels)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 != 0) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"NamedFramebufferTexture for ");
    local_1c0.m_getName = glu::getFramebufferAttachmentName;
    local_1c0.m_value = attachment;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::operator<<((ostream *)this_00," attachment of ");
    local_1d0.m_getName = glu::getTextureTargetName;
    local_1d0.m_value = texture_target;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::operator<<((ostream *)this_00," texture and texture level ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00," of texture with ");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00," levels failed with error value ");
    local_1e0.m_getName = glu::getErrorName;
    local_1e0.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return iVar1 == 0;
}

Assistant:

bool TextureAttachmentTest::SubTestAttachmentError(glw::GLenum attachment, glw::GLenum texture_target,
												   glw::GLuint level, glw::GLuint levels)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "NamedFramebufferTexture for " << glu::getFramebufferAttachmentStr(attachment)
			<< " attachment of " << glu::getTextureTargetStr(texture_target) << " texture and texture level " << level
			<< " of texture with " << levels << " levels failed with error value " << glu::getErrorStr(error) << "."
			<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}